

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeak_Test::
~TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeak_Test
          (TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeak_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, TwoAllocOneFreeOneLeak)
{
    char* mem = detector->allocMemory(testAllocator, 4);
    char* mem2 = detector->allocMemory(testAllocator, 12);
    detector->deallocMemory(testAllocator, mem);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking));
    CHECK(output.contains("Leak size: 12"));
    CHECK(!output.contains("Leak size: 4"));
    PlatformSpecificFree(mem2);
    LONGS_EQUAL(2, testAllocator->alloc_called);
    LONGS_EQUAL(1, testAllocator->free_called);
}